

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O0

char * parse_filename(char *ptr,size_t len)

{
  char *pcVar1;
  size_t sVar2;
  char local_39;
  char stop;
  char *q;
  char *p;
  char *copy;
  size_t len_local;
  char *ptr_local;
  
  ptr_local = (char *)malloc(len + 1);
  if (ptr_local == (char *)0x0) {
    ptr_local = (char *)0x0;
  }
  else {
    memcpy(ptr_local,ptr,len);
    ptr_local[len] = '\0';
    if ((*ptr_local == '\'') || (*ptr_local == '\"')) {
      local_39 = *ptr_local;
      q = ptr_local + 1;
    }
    else {
      local_39 = ';';
      q = ptr_local;
    }
    pcVar1 = strchr(q,(int)local_39);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    pcVar1 = strrchr(q,0x2f);
    if ((pcVar1 == (char *)0x0) || (q = pcVar1 + 1, *q != '\0')) {
      pcVar1 = strrchr(q,0x5c);
      if ((pcVar1 == (char *)0x0) || (q = pcVar1 + 1, *q != '\0')) {
        pcVar1 = strchr(q,0xd);
        if (pcVar1 != (char *)0x0) {
          *pcVar1 = '\0';
        }
        pcVar1 = strchr(q,10);
        if (pcVar1 != (char *)0x0) {
          *pcVar1 = '\0';
        }
        if (ptr_local != q) {
          sVar2 = strlen(q);
          memmove(ptr_local,q,sVar2 + 1);
        }
      }
      else {
        free(ptr_local);
        ptr_local = (char *)0x0;
      }
    }
    else {
      free(ptr_local);
      ptr_local = (char *)0x0;
    }
  }
  return ptr_local;
}

Assistant:

static char *parse_filename(const char *ptr, size_t len)
{
  char *copy;
  char *p;
  char *q;
  char  stop = '\0';

  /* simple implementation of strndup() */
  copy = malloc(len + 1);
  if(!copy)
    return NULL;
  memcpy(copy, ptr, len);
  copy[len] = '\0';

  p = copy;
  if(*p == '\'' || *p == '"') {
    /* store the starting quote */
    stop = *p;
    p++;
  }
  else
    stop = ';';

  /* scan for the end letter and stop there */
  q = strchr(p, stop);
  if(q)
    *q = '\0';

  /* if the filename contains a path, only use filename portion */
  q = strrchr(p, '/');
  if(q) {
    p = q + 1;
    if(!*p) {
      curlx_safefree(copy);
      return NULL;
    }
  }

  /* If the filename contains a backslash, only use filename portion. The idea
     is that even systems that do not handle backslashes as path separators
     probably want the path removed for convenience. */
  q = strrchr(p, '\\');
  if(q) {
    p = q + 1;
    if(!*p) {
      curlx_safefree(copy);
      return NULL;
    }
  }

  /* make sure the filename does not end in \r or \n */
  q = strchr(p, '\r');
  if(q)
    *q = '\0';

  q = strchr(p, '\n');
  if(q)
    *q = '\0';

  if(copy != p)
    memmove(copy, p, strlen(p) + 1);

#if defined(_WIN32) || defined(MSDOS)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, copy, 0);
    curlx_safefree(copy);
    if(sc)
      return NULL;
    copy = sanitized;
  }
#endif /* _WIN32 || MSDOS */

  return copy;
}